

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void cmp_DD(void)

{
  byte bVar1;
  byte bVar2;
  byte local_a;
  uint flags;
  
  except = '\0';
  bVar1 = getbyte(pc);
  bVar2 = getbyte(pc + 1);
  temp1 = getbyte((ushort)bVar1 + (ushort)bVar2 * 0x100 + (ushort)x_reg);
  asm("push ax");
  asm("CLC");
  if (carry_f == '\0') {
    asm("STC");
  }
  _AL = acc;
  _AH = temp1;
  asm("cmp AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("pop AX");
  carry_f = local_a & 1 ^ 1;
  result_f = local_a & 0xc0 ^ 0x40;
  pc = pc + 2;
  return;
}

Assistant:

void cmp_DD(void) {
    uint flags;
    CLE;
    temp1 = getbyte(getbyte(pc) + 0x100 * getbyte(pc + 1) + x_reg);

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc += 2;
}